

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_unittest.cpp
# Opt level: O2

void __thiscall Array_sub_ranges_by_index_Test::TestBody(Array_sub_ranges_by_index_Test *this)

{
  reference pvVar1;
  char *pcVar2;
  int i;
  size_type i_00;
  long lVar3;
  AssertHelper local_a8;
  AssertionResult gtest_ar_2;
  AssertHelper local_90;
  by_value v2;
  array_reference_type r1;
  by_value v1;
  
  memory::
  Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::Array<int,void>((Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
                     *)&v1.super_ArrayView<double,_memory::HostCoordinator<double>_>,10);
  for (i_00 = 0; i_00 != 10; i_00 = i_00 + 1) {
    pvVar1 = memory::
             ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&v1.super_ArrayView<double,_memory::HostCoordinator<double>_>,i_00);
    *pvVar1 = (double)(int)i_00;
  }
  v2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_8_ = 5;
  memory::
  ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&r1,&v1.super_ArrayView<double,_memory::HostCoordinator<double>_>);
  gtest_ar_2._0_8_ =
       r1.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .size_;
  local_a8.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&v2,"r1.size()","5",(unsigned_long *)&gtest_ar_2,(int *)&local_a8);
  if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_);
  gtest_ar_2._0_8_ = v1.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ + 5;
  local_a8.data_ =
       (AssertHelperData *)
       r1.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .pointer_;
  testing::internal::CmpHelperEQ<double*,double*>
            ((internal *)&v2,"v1.data()+5","r1.data()",(double **)&gtest_ar_2,(double **)&local_a8);
  if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_);
  memory::
  Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::
  Array<memory::ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>&,void>
            ((Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
              *)&v2,&r1);
  local_a8.data_ =
       (AssertHelperData *)
       r1.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .pointer_;
  local_90.data_ =
       (AssertHelperData *)v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
  testing::internal::CmpHelperNE<double*,double*>
            ((internal *)&gtest_ar_2,"r1.data()","v2.data()",(double **)&local_a8,
             (double **)&local_90);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_a8.data_ =
       (AssertHelperData *)
       r1.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .size_;
  local_90.data_ =
       (AssertHelperData *)v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_2,"r1.size()","v2.size()",(unsigned_long *)&local_a8,
             (unsigned_long *)&local_90);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 8) {
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar_2,"it1[i+5]","it2[i]",
               (double *)
               ((long)v1.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ +
               lVar3 + 0x28),
               (double *)
               ((long)v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ + lVar3)
              );
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&local_a8);
      pcVar2 = "";
      if (gtest_ar_2.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
                 ,0x70,pcVar2);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
  }
  memory::
  Array<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array(&v2);
  memory::
  Array<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array(&v1);
  return;
}

Assistant:

TEST(Array, sub_ranges_by_index) {
    using namespace memory;

    typedef Array<double, HostCoordinator<double> > by_value;
    typedef ArrayView<double, HostCoordinator<double> > by_reference;

    // check that reference range from a subrange works
    by_value v1(10);
    for(int i=0; i<10; i++)
        v1[i] = double(i);

    // create a reference wrapper to the second half of v1
    auto r1 = v1(5,end);
    EXPECT_EQ(r1.size(), 5);
    EXPECT_EQ(v1.data()+5, r1.data());

    // create a value wrapper (copy) of the reference range
    // should contain a copy of the second half of v1
    by_value v2(r1);
    EXPECT_NE(r1.data(), v2.data());
    EXPECT_EQ(r1.size(), v2.size());
    auto it1 = v1.data();
    auto it2 = v2.data();
    for(auto i=0; i<5; ++i) {
        EXPECT_EQ(it1[i+5], it2[i]);
    }
}